

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_string.c
# Opt level: O0

void assert_is_string(cJSON *string_item)

{
  cJSON *string_item_local;
  
  if (string_item == (cJSON *)0x0) {
    UnityFail("Item is NULL.",0x23);
  }
  if (string_item->next != (cJSON *)0x0) {
    UnityFail("Linked list next pointer is not NULL.",0x25);
  }
  if (string_item->prev != (cJSON *)0x0) {
    UnityFail("Linked list previous pointer is not NULL.",0x25);
  }
  if (string_item->child != (cJSON *)0x0) {
    UnityFail("Item has a child.",0x26);
  }
  UnityAssertBits(0xff,0x10,(long)string_item->type,"Item doesn\'t have expected type.",0x27);
  UnityAssertBits(0x100,0,(long)string_item->type,"Item should not have a string as reference.",0x28
                 );
  UnityAssertBits(0x200,0,(long)string_item->type,"Item should not have a const string.",0x29);
  if (string_item->valuestring == (char *)0x0) {
    UnityFail("Valuestring is NULL.",0x2a);
  }
  if (string_item->string != (char *)0x0) {
    UnityFail("String is not NULL.",0x2b);
  }
  return;
}

Assistant:

static void assert_is_string(cJSON *string_item)
{
    TEST_ASSERT_NOT_NULL_MESSAGE(string_item, "Item is NULL.");

    assert_not_in_list(string_item);
    assert_has_no_child(string_item);
    assert_has_type(string_item, cJSON_String);
    assert_has_no_reference(string_item);
    assert_has_no_const_string(string_item);
    assert_has_valuestring(string_item);
    assert_has_no_string(string_item);
}